

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deck.cpp
# Opt level: O0

void __thiscall Deck::Deck(Deck *this)

{
  int local_28;
  int local_24;
  Card local_20;
  Card card;
  uint j;
  uint i;
  Deck *this_local;
  
  std::vector<Card,_std::allocator<Card>_>::vector(&this->m_deck);
  for (card.m_rank = 0; (uint)card.m_rank < 4; card.m_rank = card.m_rank + 1) {
    for (card.m_suit = 0; (uint)card.m_suit < 0xd; card.m_suit = card.m_suit + 1) {
      local_24 = card.m_rank;
      local_28 = card.m_suit;
      Card::Card(&local_20,&local_24,&local_28);
      std::vector<Card,_std::allocator<Card>_>::push_back(&this->m_deck,&local_20);
    }
  }
  return;
}

Assistant:

Deck::Deck()
{
    for (unsigned int i(0); i < SUIT_MAX; ++i)
    {
        for (unsigned int j(0); j < RANK_MAX; ++j)
        {
            Card card(i, j);
            m_deck.push_back(card);
        }
    }
}